

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::addData(Group *this,uint lgSize)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> **ppRVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  DataLocationUsage *pDVar6;
  DataLocation *pDVar7;
  RemoveConst<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pRVar8;
  DataLocationUsage *pDVar9;
  ulong uVar10;
  DataLocation *pDVar11;
  ulong uVar12;
  size_t sVar13;
  Union *this_00;
  uint uVar14;
  DataLocationUsage local_4c;
  uint local_44;
  ulong local_40;
  Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *local_38;
  
  addMember(this);
  this_00 = this->parent;
  pDVar7 = (this_00->dataLocations).builder.ptr;
  pDVar11 = (this_00->dataLocations).builder.pos;
  if (pDVar11 != pDVar7) {
    local_38 = &this->parentDataLocationUsage;
    uVar14 = 0xffffffff;
    uVar12 = 0;
    local_40 = 0;
    do {
      pDVar6 = (this->parentDataLocationUsage).builder.ptr;
      pDVar9 = (this->parentDataLocationUsage).builder.pos;
      if ((long)pDVar9 - (long)pDVar6 >> 3 == uVar12) {
        if (pDVar9 == (this->parentDataLocationUsage).builder.endPtr) {
          sVar13 = (long)pDVar9 - (long)pDVar6 >> 2;
          if (pDVar9 == pDVar6) {
            sVar13 = 4;
          }
          kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
          setCapacity(local_38,sVar13);
          pDVar9 = (this->parentDataLocationUsage).builder.pos;
        }
        pDVar9->isUsed = false;
        (pDVar9->holes).holes[0] = '\0';
        (pDVar9->holes).holes[1] = '\0';
        (pDVar9->holes).holes[2] = '\0';
        (pDVar9->holes).holes[3] = '\0';
        (pDVar9->holes).holes[4] = '\0';
        (pDVar9->holes).holes[5] = '\0';
        ppRVar1 = &(this->parentDataLocationUsage).builder.pos;
        *ppRVar1 = *ppRVar1 + 1;
        this_00 = this->parent;
        pDVar6 = (this->parentDataLocationUsage).builder.ptr;
      }
      uVar4 = (uint)uVar12;
      uVar10 = (ulong)lgSize;
      DataLocationUsage::smallestHoleAtLeast
                (&local_4c,(DataLocation *)(pDVar6 + uVar12),
                 uVar4 * 8 + (int)(this_00->dataLocations).builder.ptr);
      if ((local_4c.isUsed == true) && ((uint)local_4c.holes.holes._2_4_ < uVar14)) {
        local_40 = CONCAT71((int7)(uVar10 >> 8),1);
        uVar14 = local_4c.holes.holes._2_4_;
        local_44 = uVar4;
      }
      uVar12 = (ulong)(uVar4 + 1);
      this_00 = this->parent;
      pDVar7 = (this_00->dataLocations).builder.ptr;
      pDVar11 = (this_00->dataLocations).builder.pos;
    } while (uVar12 < (ulong)((long)pDVar11 - (long)pDVar7 >> 3));
    if ((local_40 & 1) != 0) {
      uVar5 = DataLocationUsage::allocateFromHole
                        ((this->parentDataLocationUsage).builder.ptr + local_44,this,
                         pDVar7 + local_44,lgSize);
      return uVar5;
    }
  }
  if (pDVar11 != pDVar7) {
    uVar12 = 0;
    uVar10 = 1;
    do {
      DataLocationUsage::tryAllocateByExpanding
                (&local_4c,(Group *)((this->parentDataLocationUsage).builder.ptr + uVar12),
                 (DataLocation *)this,(int)pDVar7 + (int)uVar12 * 8);
      if (local_4c.isUsed == true) {
        uVar5._0_1_ = local_4c.holes.holes[2];
        uVar5._1_1_ = local_4c.holes.holes[3];
        uVar5._2_1_ = local_4c.holes.holes[4];
        uVar5._3_1_ = local_4c.holes.holes[5];
        return uVar5;
      }
      this_00 = this->parent;
      pDVar7 = (this_00->dataLocations).builder.ptr;
      bVar3 = uVar10 < (ulong)((long)(this_00->dataLocations).builder.pos - (long)pDVar7 >> 3);
      uVar12 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
  }
  uVar5 = Union::addNewDataLocation(this_00,lgSize);
  pRVar8 = (this->parentDataLocationUsage).builder.pos;
  if (pRVar8 == (this->parentDataLocationUsage).builder.endPtr) {
    pRVar2 = (this->parentDataLocationUsage).builder.ptr;
    sVar13 = 4;
    if (pRVar8 != pRVar2) {
      sVar13 = (long)pRVar8 - (long)pRVar2 >> 2;
    }
    kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::setCapacity
              (&this->parentDataLocationUsage,sVar13);
    pRVar8 = (this->parentDataLocationUsage).builder.pos;
  }
  pRVar8->isUsed = true;
  pRVar8->lgSizeUsed = (uint8_t)lgSize;
  (pRVar8->holes).holes[0] = '\0';
  (pRVar8->holes).holes[1] = '\0';
  (pRVar8->holes).holes[2] = '\0';
  (pRVar8->holes).holes[3] = '\0';
  (pRVar8->holes).holes[4] = '\0';
  (pRVar8->holes).holes[5] = '\0';
  ppRVar1 = &(this->parentDataLocationUsage).builder.pos;
  *ppRVar1 = *ppRVar1 + 1;
  return uVar5;
}

Assistant:

uint addData(uint lgSize) override {
      addMember();

      uint bestSize = kj::maxValue;
      kj::Maybe<uint> bestLocation = kj::none;

      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        // If we haven't seen this DataLocation yet, add a corresponding DataLocationUsage.
        if (parentDataLocationUsage.size() == i) {
          parentDataLocationUsage.add();
        }

        auto& usage = parentDataLocationUsage[i];
        KJ_IF_SOME(hole, usage.smallestHoleAtLeast(parent.dataLocations[i], lgSize)) {
          if (hole < bestSize) {
            bestSize = hole;
            bestLocation = i;
          }
        }
      }

      KJ_IF_SOME(best, bestLocation) {
        return parentDataLocationUsage[best].allocateFromHole(
            *this, parent.dataLocations[best], lgSize);
      }

      // There are no holes at all in the union big enough to fit this field.  Go back through all
      // of the locations and attempt to expand them to fit.
      for (uint i = 0; i < parent.dataLocations.size(); i++) {
        KJ_IF_SOME(result, parentDataLocationUsage[i].tryAllocateByExpanding(
            *this, parent.dataLocations[i], lgSize)) {
          return result;
        }
      }

      // Couldn't find any space in the existing locations, so add a new one.
      uint result = parent.addNewDataLocation(lgSize);
      parentDataLocationUsage.add(lgSize);
      return result;
    }